

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_LOW(Expression *expr,Expression *src)

{
  bool bVar1;
  uint8_t *puVar2;
  uint8_t bytes [6];
  Expression *src_local;
  Expression *expr_local;
  
  memcpy(expr,src,0x30);
  expr->isSymbol = false;
  bVar1 = rpn_isKnown(expr);
  if (bVar1) {
    expr->val = expr->val & 0xff;
  }
  else {
    expr->rpnPatchSize = expr->rpnPatchSize + 6;
    puVar2 = reserveSpace(expr,6);
    puVar2[0] = 0x80;
    puVar2[1] = 0xff;
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\x11';
  }
  return;
}

Assistant:

void rpn_LOW(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;
	expr->isSymbol = false;

	if (rpn_isKnown(expr)) {
		expr->val = expr->val & 0xFF;
	} else {
		uint8_t bytes[] = {RPN_CONST, 0xFF, 0, 0, 0, RPN_AND};

		expr->rpnPatchSize += sizeof(bytes);
		memcpy(reserveSpace(expr, sizeof(bytes)), bytes, sizeof(bytes));
	}
}